

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

void __thiscall QList<QTzTransition>::resize(QList<QTzTransition> *this,qsizetype size)

{
  QTzTransition *pQVar1;
  qint64 *pqVar2;
  Data *pDVar3;
  long lVar4;
  QTzTransition *pQVar5;
  qint64 qVar6;
  long lVar7;
  
  pDVar3 = (this->d).d;
  if (((pDVar3 == (Data *)0x0) ||
      (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
     ((pDVar3->super_QArrayData).alloc -
      ((long)((long)(this->d).ptr -
             ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 4) <
      size)) {
    QArrayDataPointer<QTzTransition>::detachAndGrow
              (&this->d,GrowsAtEnd,size - (this->d).size,(QTzTransition **)0x0,
               (QArrayDataPointer<QTzTransition> *)0x0);
  }
  else if (size < (this->d).size) {
    (this->d).size = size;
  }
  lVar4 = (this->d).size;
  if (lVar4 < size) {
    pQVar5 = (this->d).ptr;
    pQVar1 = pQVar5 + lVar4;
    pQVar1->tz_time = 0;
    *(undefined8 *)&pQVar1->tz_typeind = 0;
    if (pQVar1 + 1 != pQVar5 + size) {
      lVar7 = lVar4 * 0x10 + 0x10;
      do {
        qVar6 = *(qint64 *)&pQVar5[lVar4].tz_typeind;
        pqVar2 = (qint64 *)((long)&pQVar5->tz_time + lVar7);
        *pqVar2 = pQVar5[lVar4].tz_time;
        pqVar2[1] = qVar6;
        lVar7 = lVar7 + 0x10;
      } while (size * 0x10 != lVar7);
    }
    (this->d).size = size;
  }
  return;
}

Assistant:

void resize(qsizetype size)
    {
        resize_internal(size);
        if (size > this->size())
            d->appendInitialize(size);
    }